

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::GetCameraAngle(ON_Viewport *this,double *angle)

{
  bool bVar1;
  double local_38;
  double dStack_28;
  bool rc;
  double angle_w;
  double angle_h;
  double *angle_local;
  ON_Viewport *this_local;
  
  angle_w = 0.0;
  dStack_28 = 0.0;
  angle_h = (double)angle;
  angle_local = (double *)this;
  bVar1 = GetCameraAngle(this,(double *)0x0,&angle_w,&stack0xffffffffffffffd8);
  if ((angle_h != 0.0) && (bVar1)) {
    if (dStack_28 <= angle_w) {
      local_38 = dStack_28;
    }
    else {
      local_38 = angle_w;
    }
    *(double *)angle_h = local_38;
  }
  return bVar1;
}

Assistant:

bool ON_Viewport::GetCameraAngle( 
       double* angle
       ) const
{
  double angle_h = 0.0;
  double angle_w = 0.0;
  bool rc = GetCameraAngle( nullptr, &angle_h, &angle_w );
  if ( angle && rc ) {
    *angle = (angle_h < angle_w) ? angle_h : angle_w;
  }
  return rc;
}